

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

bool __thiscall IRBuilder::DoBailOnNoProfile(IRBuilder *this)

{
  bool bVar1;
  uint16 uVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this_00;
  JITTimeFunctionBody *this_01;
  Func *this_02;
  
  sourceContextId = Func::GetSourceContextId(this->m_func->topFunc);
  functionId = Func::GetLocalFunctionId(this->m_func->topFunc);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,BailOnNoProfilePhase,sourceContextId,functionId);
  if ((!bVar1) &&
     (uVar2 = JITTimeWorkItem::GetProfiledIterations(this->m_func->topFunc->m_workItem), uVar2 != 0)
     ) {
    bVar1 = Func::HasProfileInfo(this->m_func);
    if (bVar1) {
      this_00 = Func::GetReadOnlyProfileInfo(this->m_func);
      bVar1 = JITTimeProfileInfo::IsNoProfileBailoutsDisabled(this_00);
      if (bVar1) {
        return false;
      }
    }
    bVar1 = Func::DoGlobOpt(this->m_func);
    if (bVar1) {
      this_02 = this->m_func;
      if (this_02->topFunc != this_02) {
        bVar1 = Js::ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Js::Configuration::Global,ForceJITLoopBodyFlag);
        if (bVar1) {
          return false;
        }
        this_02 = this->m_func;
      }
      bVar1 = Func::HasProfileInfo(this_02);
      if (bVar1) {
        this_01 = Func::GetJITFunctionBody(this->m_func->topFunc);
        bVar1 = JITTimeFunctionBody::IsCoroutine(this_01);
        if ((!bVar1) || (bVar1 = Func::IsLoopBody(this->m_func), bVar1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
IRBuilder::DoBailOnNoProfile()
{
    if (PHASE_OFF(Js::BailOnNoProfilePhase, this->m_func->GetTopFunc()))
    {
        return false;
    }

    Func *const topFunc = m_func->GetTopFunc();
    if(topFunc->GetWorkItem()->GetProfiledIterations() == 0)
    {
        // The top function has not been profiled yet. Some switch must have been used to force jitting. This is not a
        // real-world case, but for the purpose of testing the JIT, it's beneficial to generate code in unprofiled paths.
        return false;
    }

    if (m_func->HasProfileInfo() && m_func->GetReadOnlyProfileInfo()->IsNoProfileBailoutsDisabled())
    {
        return false;
    }

    if (!m_func->DoGlobOpt())
    {
        return false;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (this->m_func->GetTopFunc() != this->m_func && Js::Configuration::Global.flags.IsEnabled(Js::ForceJITLoopBodyFlag))
    {
        // No profile data for loop bodies with -force...
        return false;
    }
#endif

    if (!this->m_func->HasProfileInfo())
    {
        return false;
    }

    if (m_func->GetTopFunc()->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
    {
        return false;
    }

    return true;
}